

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Nf_ManPrepareGate(int nVars,word uTruth,int *pComp,int *pPerm,Vec_Wrd_t *vResult)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar3 = Extra_Factorial(nVars);
  uVar11 = 1 << ((byte)nVars & 0x1f);
  vResult->nSize = 0;
  if ((int)uVar11 < 2) {
    uVar11 = 1;
  }
  lVar4 = 0;
  do {
    uVar6 = -lVar4 ^ uTruth;
    uVar8 = uVar6;
    if (0 < (int)uVar3) {
      uVar9 = 0;
      do {
        uVar7 = uVar8;
        if (nVars != 0x1f) {
          uVar12 = 0;
          do {
            uVar1 = vResult->nCap;
            if (vResult->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (vResult->pArray == (word *)0x0) {
                  pwVar5 = (word *)malloc(0x80);
                }
                else {
                  pwVar5 = (word *)realloc(vResult->pArray,0x80);
                }
                vResult->pArray = pwVar5;
                iVar10 = 0x10;
              }
              else {
                iVar10 = uVar1 * 2;
                if (iVar10 <= (int)uVar1) goto LAB_004095be;
                if (vResult->pArray == (word *)0x0) {
                  pwVar5 = (word *)malloc((ulong)uVar1 << 4);
                }
                else {
                  pwVar5 = (word *)realloc(vResult->pArray,(ulong)uVar1 << 4);
                }
                vResult->pArray = pwVar5;
              }
              if (pwVar5 == (word *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
              vResult->nCap = iVar10;
            }
LAB_004095be:
            iVar10 = vResult->nSize;
            vResult->nSize = iVar10 + 1;
            vResult->pArray[iVar10] = uVar7;
            bVar2 = (byte)(1L << ((byte)pComp[uVar12] & 0x3f));
            uVar7 = (s_Truths6[pComp[uVar12]] & uVar7) >> (bVar2 & 0x3f) |
                    uVar7 << (bVar2 & 0x3f) & s_Truths6[pComp[uVar12]];
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        if (uVar8 != uVar7) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                        ,0x54b,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
        }
        iVar10 = pPerm[uVar9];
        bVar2 = (byte)(1L << ((byte)iVar10 & 0x3f));
        uVar8 = (uVar7 & s_PMasks[iVar10][2]) >> (bVar2 & 0x3f) |
                (s_PMasks[iVar10][1] & uVar7) << (bVar2 & 0x3f) | s_PMasks[iVar10][0] & uVar7;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
    }
    if (uVar6 != uVar8) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x54e,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
    }
    bVar13 = lVar4 != 0;
    lVar4 = lVar4 + 1;
    if (bVar13) {
      return;
    }
  } while( true );
}

Assistant:

void Nf_ManPrepareGate( int nVars, word uTruth, int * pComp, int * pPerm, Vec_Wrd_t * vResult )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    Vec_WrdClear( vResult );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                Vec_WrdPush( vResult, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
}